

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O2

void __thiscall
icu_63::Normalizer2DataBuilder::writeDataFile
          (Normalizer2DataBuilder *this,char *filename,bool writeRemoved)

{
  short sVar1;
  undefined8 uVar2;
  MappingType MVar3;
  int iVar4;
  UBool UVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  FILE *__stream;
  Norm *pNVar11;
  UnicodeString *s1;
  UnicodeString *pUVar12;
  byte bVar13;
  MappingType MVar14;
  byte bVar15;
  UnicodeString *s2;
  char *__format;
  int iVar16;
  UChar32 UVar17;
  UChar32 UVar18;
  MappingType MVar19;
  int local_e4;
  int local_e0;
  UnicodeSetIterator ccIter;
  UnicodeSetIterator mIter;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"gennorm2/writeDataFile() error: unable to create the output file %s\n",filename
           );
    exit(4);
  }
  uVar2._0_1_ = this->unicodeVersion[0];
  uVar2._1_1_ = this->unicodeVersion[1];
  uVar2._2_1_ = this->unicodeVersion[2];
  uVar2._3_1_ = this->unicodeVersion[3];
  uVar2._4_4_ = *(undefined4 *)&this->field_0x27c;
  if ((int)uVar2 != 0) {
    u_versionToString_63(this->unicodeVersion,(char *)&ccIter);
    fprintf(__stream,"* Unicode %s\n\n",&ccIter);
  }
  UnicodeSetIterator::UnicodeSetIterator(&ccIter,(UnicodeSet *)this);
  bVar7 = false;
  local_e0 = -1;
  bVar15 = 0;
  iVar16 = -1;
  do {
    UVar5 = UnicodeSetIterator::next(&ccIter);
    UVar17 = ccIter.codepoint;
    UVar18 = 0x110000;
    bVar8 = true;
    if ((UVar5 == '\0') || (ccIter.codepoint == -1)) {
      bVar6 = 0;
    }
    else {
      bVar6 = Norms::getCC(&this->norms,ccIter.codepoint);
      bVar8 = false;
      UVar18 = UVar17;
    }
    bVar13 = bVar15;
    iVar4 = local_e0;
    if ((bVar6 != bVar15 || UVar18 != iVar16 + 1) && (bVar13 = bVar6, iVar4 = UVar18, bVar15 != 0))
    {
      if (local_e0 == iVar16) {
        fprintf(__stream,"%04lX:%d\n",(long)local_e0,(ulong)bVar15);
      }
      else {
        fprintf(__stream,"%04lX..%04lX:%d\n",(long)local_e0,(long)iVar16);
      }
      bVar7 = true;
    }
    local_e0 = iVar4;
    bVar15 = bVar13;
    iVar16 = UVar18;
  } while (!bVar8);
  if (bVar7) {
    fputs("\n",__stream);
  }
  UnicodeSetIterator::UnicodeSetIterator(&mIter,&(this->norms).mappingSet);
  local_e4 = -1;
  MVar19 = NONE;
  s2 = (UnicodeString *)0x0;
  iVar16 = -1;
  do {
    UVar5 = UnicodeSetIterator::next(&mIter);
    UVar17 = mIter.codepoint;
    if ((UVar5 == '\0') || (mIter.codepoint == -1)) {
      bVar7 = true;
      UVar17 = 0x110000;
LAB_001e9096:
      s1 = (UnicodeString *)0x0;
      MVar14 = NONE;
    }
    else {
      pNVar11 = Norms::getNorm(&this->norms,mIter.codepoint);
      if ((pNVar11 == (Norm *)0x0) || (MVar14 = pNVar11->mappingType, MVar14 == NONE)) {
        bVar7 = false;
        goto LAB_001e9096;
      }
      s1 = pNVar11->mapping;
      bVar7 = false;
    }
    if ((MVar14 != MVar19) ||
       (bVar8 = anon_unknown_1::equalStrings(s1,s2), pUVar12 = s2, MVar3 = MVar19, iVar4 = local_e4,
       !bVar8 || UVar17 != iVar16 + 1)) {
      pUVar12 = s1;
      MVar3 = MVar14;
      iVar4 = UVar17;
      if (writeRemoved) {
        if (MVar19 != NONE) {
LAB_001e90d6:
          if (local_e4 == iVar16) {
            fprintf(__stream,"%04lX%c",(long)local_e4,(ulong)(uint)(int)"?-=>"[MVar19]);
          }
          else {
            fprintf(__stream,"%04lX..%04lX%c",(long)local_e4,(long)iVar16,
                    (ulong)(uint)(int)"?-=>"[MVar19]);
          }
          if ((s2 != (UnicodeString *)0x0) &&
             (0x1f < (ushort)(s2->fUnion).fStackFields.fLengthAndFlags)) {
            uVar9 = UnicodeString::char32At(s2,0);
            iVar16 = 0;
            __format = "%04lX";
            while( true ) {
              fprintf(__stream,__format,(long)(int)uVar9);
              sVar1 = (s2->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar10 = (s2->fUnion).fFields.fLength;
              }
              else {
                iVar10 = (int)sVar1 >> 5;
              }
              iVar16 = (iVar16 - (uint)(uVar9 < 0x10000)) + 2;
              if (iVar10 <= iVar16) break;
              uVar9 = UnicodeString::char32At(s2,iVar16);
              __format = " %04lX";
            }
          }
          fputs("\n",__stream);
        }
      }
      else if (1 < (int)MVar19) goto LAB_001e90d6;
    }
    local_e4 = iVar4;
    MVar19 = MVar3;
    s2 = pUVar12;
    iVar16 = UVar17;
    if (bVar7) {
      fclose(__stream);
      UnicodeSetIterator::~UnicodeSetIterator(&mIter);
      UnicodeSetIterator::~UnicodeSetIterator(&ccIter);
      return;
    }
  } while( true );
}

Assistant:

void
Normalizer2DataBuilder::writeDataFile(const char *filename, bool writeRemoved) const {
    // Do not processData() before writing the input-syntax data file.
    FILE *f = fopen(filename, "w");
    if(f == nullptr) {
        fprintf(stderr, "gennorm2/writeDataFile() error: unable to create the output file %s\n",
                filename);
        exit(U_FILE_ACCESS_ERROR);
        return;
    }

    if(unicodeVersion[0] != 0 || unicodeVersion[1] != 0 ||
            unicodeVersion[2] != 0 || unicodeVersion[3] != 0) {
        char uv[U_MAX_VERSION_STRING_LENGTH];
        u_versionToString(unicodeVersion, uv);
        fprintf(f, "* Unicode %s\n\n", uv);
    }

    UnicodeSetIterator ccIter(norms.ccSet);
    UChar32 start = U_SENTINEL;
    UChar32 end = U_SENTINEL;
    uint8_t prevCC = 0;
    bool done = false;
    bool didWrite = false;
    do {
        UChar32 c;
        uint8_t cc;
        if(ccIter.next() && !ccIter.isString()) {
            c = ccIter.getCodepoint();
            cc = norms.getCC(c);
        } else {
            c = 0x110000;
            cc = 0;
            done = true;
        }
        if(cc == prevCC && c == (end + 1)) {
            end = c;
        } else {
            if(prevCC != 0) {
                if(start == end) {
                    fprintf(f, "%04lX:%d\n", (long)start, (int)prevCC);
                } else {
                    fprintf(f, "%04lX..%04lX:%d\n", (long)start, (long)end, (int)prevCC);
                }
                didWrite = true;
            }
            start = end = c;
            prevCC = cc;
        }
    } while(!done);
    if(didWrite) {
        fputs("\n", f);
    }

    UnicodeSetIterator mIter(norms.mappingSet);
    start = U_SENTINEL;
    end = U_SENTINEL;
    const UnicodeString *prevMapping = nullptr;
    Norm::MappingType prevType = Norm::NONE;
    done = false;
    do {
        UChar32 c;
        const Norm *norm;
        if(mIter.next() && !mIter.isString()) {
            c = mIter.getCodepoint();
            norm = norms.getNorm(c);
        } else {
            c = 0x110000;
            norm = nullptr;
            done = true;
        }
        const UnicodeString *mapping;
        Norm::MappingType type;
        if(norm == nullptr) {
            mapping = nullptr;
            type = Norm::NONE;
        } else {
            type = norm->mappingType;
            if(type == Norm::NONE) {
                mapping = nullptr;
            } else {
                mapping = norm->mapping;
            }
        }
        if(type == prevType && equalStrings(mapping, prevMapping) && c == (end + 1)) {
            end = c;
        } else {
            if(writeRemoved ? prevType != Norm::NONE : prevType > Norm::REMOVED) {
                if(start == end) {
                    fprintf(f, "%04lX%c", (long)start, typeChars[prevType]);
                } else {
                    fprintf(f, "%04lX..%04lX%c", (long)start, (long)end, typeChars[prevType]);
                }
                writeMapping(f, prevMapping);
            }
            start = end = c;
            prevMapping = mapping;
            prevType = type;
        }
    } while(!done);

    fclose(f);
}